

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_mem.c
# Opt level: O2

AliasRet aa_ahref(jit_State *J,IRIns *refa,IRIns *refb)

{
  IROp1 *pIVar1;
  ushort uVar2;
  ushort uVar3;
  IRIns *pIVar4;
  AliasRet AVar5;
  IRRef2 IVar6;
  ushort uVar7;
  IRRef2 IVar8;
  ushort uVar9;
  ushort uVar10;
  IRIns *pIVar11;
  IRIns *pIVar12;
  
  if (refa == refb) {
    return ALIAS_MUST;
  }
  uVar7 = (refb->field_0).op2;
  uVar10 = (refa->field_0).op2;
  pIVar4 = (J->cur).ir;
  pIVar12 = pIVar4 + uVar10;
  if ((pIVar12->field_1).o == '\x1e') {
    uVar10 = (pIVar12->field_0).op1;
    pIVar12 = pIVar4 + uVar10;
  }
  pIVar11 = pIVar4 + uVar7;
  if ((pIVar11->field_1).o == '\x1e') {
    uVar7 = (pIVar11->field_0).op1;
    pIVar11 = pIVar4 + uVar7;
  }
  pIVar1 = &(refa->field_1).o;
  if ((*pIVar1 & 0xfe) == 0x38) {
    refa = pIVar4 + (refa->field_0).op1;
  }
  if (((refb->field_1).o & 0xfe) == 0x38) {
    refb = pIVar4 + (refb->field_0).op1;
  }
  uVar2 = (refa->field_0).op1;
  uVar3 = (refb->field_0).op1;
  if (uVar10 == uVar7) {
    if (uVar2 == uVar3) {
      return ALIAS_MUST;
    }
    goto LAB_001236f8;
  }
  if ((-1 < (short)uVar10) && (-1 < (short)uVar7)) {
    return ALIAS_NO;
  }
  if (*pIVar1 == 0x38) {
    IVar8 = 0;
    uVar9 = uVar10;
    if (((pIVar12->field_1).o == ')') && (-1 < (long)(short)(pIVar12->field_0).op2)) {
      uVar9 = (pIVar12->field_0).op1;
      IVar8 = pIVar4[(short)(pIVar12->field_0).op2].field_1.op12;
      if ((uVar9 != uVar7) || (IVar8 == 0)) goto LAB_00123742;
    }
    else {
LAB_00123742:
      IVar6 = 0;
      if (((pIVar11->field_1).o == ')') && (IVar6 = 0, -1 < (long)(short)(pIVar11->field_0).op2)) {
        uVar7 = (pIVar11->field_0).op1;
        IVar6 = pIVar4[(short)(pIVar11->field_0).op2].field_1.op12;
        if ((uVar10 == uVar7) && (IVar6 != 0)) goto LAB_0012376e;
      }
      if ((uVar9 != uVar7) || (IVar8 == IVar6)) goto LAB_0012377f;
    }
LAB_0012376e:
    AVar5 = ALIAS_NO;
  }
  else {
    if ((((pIVar11->field_1).t.irt ^ (pIVar12->field_1).t.irt) & 0x1f) != 0) {
      return ALIAS_NO;
    }
LAB_0012377f:
    if (uVar2 != uVar3) {
LAB_001236f8:
      AVar5 = aa_table(J,(uint)uVar2,(uint)uVar3);
      return AVar5;
    }
    AVar5 = ALIAS_MAY;
  }
  return AVar5;
}

Assistant:

static AliasRet aa_ahref(jit_State *J, IRIns *refa, IRIns *refb)
{
  IRRef ka = refa->op2;
  IRRef kb = refb->op2;
  IRIns *keya, *keyb;
  IRRef ta, tb;
  if (refa == refb)
    return ALIAS_MUST;  /* Shortcut for same refs. */
  keya = IR(ka);
  if (keya->o == IR_KSLOT) { ka = keya->op1; keya = IR(ka); }
  keyb = IR(kb);
  if (keyb->o == IR_KSLOT) { kb = keyb->op1; keyb = IR(kb); }
  ta = (refa->o==IR_HREFK || refa->o==IR_AREF) ? IR(refa->op1)->op1 : refa->op1;
  tb = (refb->o==IR_HREFK || refb->o==IR_AREF) ? IR(refb->op1)->op1 : refb->op1;
  if (ka == kb) {
    /* Same key. Check for same table with different ref (NEWREF vs. HREF). */
    if (ta == tb)
      return ALIAS_MUST;  /* Same key, same table. */
    else
      return aa_table(J, ta, tb);  /* Same key, possibly different table. */
  }
  if (irref_isk(ka) && irref_isk(kb))
    return ALIAS_NO;  /* Different constant keys. */
  if (refa->o == IR_AREF) {
    /* Disambiguate array references based on index arithmetic. */
    int32_t ofsa = 0, ofsb = 0;
    IRRef basea = ka, baseb = kb;
    lj_assertJ(refb->o == IR_AREF, "expected AREF");
    /* Gather base and offset from t[base] or t[base+-ofs]. */
    if (keya->o == IR_ADD && irref_isk(keya->op2)) {
      basea = keya->op1;
      ofsa = IR(keya->op2)->i;
      if (basea == kb && ofsa != 0)
	return ALIAS_NO;  /* t[base+-ofs] vs. t[base]. */
    }
    if (keyb->o == IR_ADD && irref_isk(keyb->op2)) {
      baseb = keyb->op1;
      ofsb = IR(keyb->op2)->i;
      if (ka == baseb && ofsb != 0)
	return ALIAS_NO;  /* t[base] vs. t[base+-ofs]. */
    }
    if (basea == baseb && ofsa != ofsb)
      return ALIAS_NO;  /* t[base+-o1] vs. t[base+-o2] and o1 != o2. */
  } else {
    /* Disambiguate hash references based on the type of their keys. */
    lj_assertJ((refa->o==IR_HREF || refa->o==IR_HREFK || refa->o==IR_NEWREF) &&
	       (refb->o==IR_HREF || refb->o==IR_HREFK || refb->o==IR_NEWREF),
	       "bad xREF IR op %d or %d", refa->o, refb->o);
    if (!irt_sametype(keya->t, keyb->t))
      return ALIAS_NO;  /* Different key types. */
  }
  if (ta == tb)
    return ALIAS_MAY;  /* Same table, cannot disambiguate keys. */
  else
    return aa_table(J, ta, tb);  /* Try to disambiguate tables. */
}